

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sleigh.cc
# Opt level: O0

void __thiscall SleighBuilder::delaySlot(SleighBuilder *this,OpTpl *op)

{
  ParserWalker *this_00;
  int4 iVar1;
  int4 iVar2;
  Address *op2;
  ParserContext *this_01;
  LowlevelError *this_02;
  Constructor *this_03;
  ConstructTpl *construct;
  undefined1 local_140 [8];
  ParserWalker newwalker;
  int4 len;
  allocator local_81;
  string local_80 [32];
  ParserContext *local_60;
  ParserContext *pos;
  Address newaddr;
  int4 bytecount;
  int4 delaySlotByteCnt;
  int4 fallOffset;
  Address baseaddr;
  uintb olduniqueoffset;
  ParserWalker *tmp;
  OpTpl *op_local;
  SleighBuilder *this_local;
  
  this_00 = (this->super_PcodeBuilder).walker;
  baseaddr.offset = this->uniqueoffset;
  op2 = ParserWalker::getAddr(this_00);
  Address::Address((Address *)&delaySlotByteCnt,op2);
  ParserWalker::getLength(this_00);
  this_01 = ParserWalker::getParserContext(this_00);
  iVar1 = ParserContext::getDelaySlot(this_01);
  newaddr.offset._4_4_ = 0;
  do {
    Address::operator+((Address *)&pos,(int4)&delaySlotByteCnt);
    setUniqueOffset(this,(Address *)&pos);
    local_60 = DisassemblyCache::getParserContext(this->discache,(Address *)&pos);
    iVar2 = ParserContext::getParserState(local_60);
    if (iVar2 != 2) {
      this_02 = (LowlevelError *)__cxa_allocate_exception(0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_80,"Could not obtain cached delay slot instruction",&local_81);
      LowlevelError::LowlevelError(this_02,(string *)local_80);
      __cxa_throw(this_02,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
    }
    newwalker._156_4_ = ParserContext::getLength(local_60);
    ParserWalker::ParserWalker((ParserWalker *)local_140,local_60);
    (this->super_PcodeBuilder).walker = (ParserWalker *)local_140;
    ParserWalker::baseState((this->super_PcodeBuilder).walker);
    this_03 = ParserWalker::getConstructor((this->super_PcodeBuilder).walker);
    construct = Constructor::getTempl(this_03);
    PcodeBuilder::build(&this->super_PcodeBuilder,construct,-1);
    newaddr.offset._4_4_ = newwalker._156_4_ + newaddr.offset._4_4_;
  } while (newaddr.offset._4_4_ < iVar1);
  (this->super_PcodeBuilder).walker = this_00;
  this->uniqueoffset = baseaddr.offset;
  return;
}

Assistant:

void SleighBuilder::delaySlot(OpTpl *op)

{				// Append pcode for an entire instruction (delay slot)
				// in the middle of the current instruction
  ParserWalker *tmp = walker;
  uintb olduniqueoffset = uniqueoffset;

  Address baseaddr = tmp->getAddr();
  int4 fallOffset = tmp->getLength();
  int4 delaySlotByteCnt = tmp->getParserContext()->getDelaySlot();
  int4 bytecount = 0;
  do {
    Address newaddr = baseaddr + fallOffset;
    setUniqueOffset(newaddr);
    const ParserContext *pos = discache->getParserContext(newaddr);
    if (pos->getParserState() != ParserContext::pcode)
      throw LowlevelError("Could not obtain cached delay slot instruction");
    int4 len = pos->getLength();

    ParserWalker newwalker( pos );
    walker = &newwalker;
    walker->baseState();
    build(walker->getConstructor()->getTempl(),-1); // Build the whole delay slot
    fallOffset += len;
    bytecount += len;
  } while(bytecount < delaySlotByteCnt);
  walker = tmp;			// Restore original context
  uniqueoffset = olduniqueoffset;
}